

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithm.h
# Opt level: O2

void idx2::Reverse<idx2::grid*>(grid *Beg,grid *End)

{
  u64 uVar1;
  u64 uVar2;
  u64 uVar3;
  u64 uVar4;
  grid *pgVar5;
  
  for (; pgVar5 = End + -1, Beg < pgVar5; Beg = Beg + 1) {
    uVar1 = Beg->Strd;
    uVar2 = (Beg->super_extent).From;
    uVar3 = (Beg->super_extent).Dims;
    Beg->Strd = End[-1].Strd;
    uVar4 = End[-1].super_extent.Dims;
    (Beg->super_extent).From = (pgVar5->super_extent).From;
    (Beg->super_extent).Dims = uVar4;
    End[-1].Strd = uVar1;
    (pgVar5->super_extent).From = uVar2;
    End[-1].super_extent.Dims = uVar3;
    End = pgVar5;
  }
  return;
}

Assistant:

void
Reverse(i Beg, i End)
{
  auto It1 = Beg;
  auto It2 = End - 1;
  while (It1 < It2)
  {
    Swap(It1, It2);
    ++It1;
    --It2;
  }
}